

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<IRR>::push(vec<IRR> *this,IRR *elem)

{
  IRR *pIVar1;
  IntRelType IVar2;
  int iVar3;
  IRR *pIVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = this->sz;
  if (uVar5 == this->cap) {
    uVar6 = 2;
    if (1 < uVar5) {
      uVar6 = (ulong)(uVar5 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar6;
    pIVar4 = (IRR *)realloc(this->data,uVar6 << 5);
    this->data = pIVar4;
    uVar5 = this->sz;
  }
  else {
    pIVar4 = this->data;
  }
  this->sz = uVar5 + 1;
  IVar2 = elem->t;
  iVar3 = elem->c;
  pIVar1 = pIVar4 + uVar5;
  pIVar1->x = elem->x;
  pIVar1->t = IVar2;
  pIVar1->c = iVar3;
  pIVar4[uVar5].r.super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
  pIVar4[uVar5].r.v = (elem->r).v;
  pIVar4[uVar5].r.s = (elem->r).s;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}